

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O2

int __thiscall
RuntimeObjectSystem::TestBuildAllRuntimeSourceFiles
          (RuntimeObjectSystem *this,ITestBuildNotifier *callback,bool bTestFileTracking)

{
  ICompilerLogger *pIVar1;
  pointer pPVar2;
  pointer pPVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  pointer this_00;
  int local_80;
  TFileList filesToTest;
  string local_50;
  
  pIVar1 = this->m_pCompilerLogger;
  if (pIVar1 != (ICompilerLogger *)0x0) {
    (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,"TestBuildAllRuntimeSourceFiles Starting\n");
  }
  pPVar2 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = 0;
  for (uVar6 = 0; uVar6 = uVar6 & 0xffff,
      uVar6 < (ulong)(((long)(this->m_Projects).
                             super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x1c8);
      uVar6 = (ulong)((int)uVar6 + 1)) {
    lVar8 = lVar8 + ((long)pPVar2[uVar6].m_RuntimeFileList.
                           super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    *(long *)&pPVar2[uVar6].m_RuntimeFileList.
                              super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                              ._M_impl.super__Vector_impl_data) / 0x28;
  }
  if (callback == (ITestBuildNotifier *)0x0) {
    callback = (ITestBuildNotifier *)this;
  }
  if (lVar8 == 0) {
    (*(((RuntimeObjectSystem *)callback)->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
      _vptr_ITestBuildNotifier[2])(callback,0,1);
  }
  iVar7 = 0;
  uVar6 = 0;
  do {
    uVar6 = uVar6 & 0xffff;
    pPVar2 = (this->m_Projects).
             super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(this->m_Projects).
                  super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2;
    if ((ulong)(lVar8 / 0x1c8) <= uVar6) {
      pIVar1 = this->m_pCompilerLogger;
      if (iVar7 == 0) {
        if (pIVar1 != (ICompilerLogger *)0x0) {
          (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,"All Tests Passed\n",lVar8 % 0x1c8);
          return 0;
        }
        return 0;
      }
      if (pIVar1 == (ICompilerLogger *)0x0) {
        return iVar7;
      }
      (*(code *)**(undefined8 **)pIVar1)(pIVar1,"Tests Failed: %d\n",iVar7);
      return iVar7;
    }
    std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::vector
              (&filesToTest,&pPVar2[uVar6].m_RuntimeFileList);
    for (this_00 = filesToTest.
                   super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pPVar3 = filesToTest.
                 super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
        this_00 !=
        filesToTest.
        super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>._M_impl.
        super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      FileSystemUtils::Path::Extension_abi_cxx11_(&local_50,this_00);
      bVar4 = std::operator!=(&local_50,".h");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar4) {
        iVar5 = TestBuildFile(this->m_pCompilerLogger,this,this_00,callback,bTestFileTracking);
        if (iVar5 < 0) {
          if (iVar5 == -0xd1e) {
            iVar5 = 0;
          }
          iVar7 = iVar7 - iVar5;
          local_80 = iVar7;
          break;
        }
        iVar7 = iVar7 + iVar5;
      }
    }
    std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector
              (&filesToTest);
    uVar6 = (ulong)((int)uVar6 + 1);
    if (this_00 != pPVar3) {
      return local_80;
    }
  } while( true );
}

Assistant:

int RuntimeObjectSystem::TestBuildAllRuntimeSourceFiles(  ITestBuildNotifier* callback, bool bTestFileTracking )
{
    if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("TestBuildAllRuntimeSourceFiles Starting\n"); }
   
    ITestBuildNotifier* failCallbackLocal = callback;
    if( !failCallbackLocal )
    {
        failCallbackLocal = this;
    }

    int numErrors = 0;

    size_t numFilesToBuild = 0;
    for( unsigned short proj = 0; proj < m_Projects.size( ); ++proj )
    {
        numFilesToBuild += m_Projects[ proj ].m_RuntimeFileList.size( );
    }

    if( 0 == numFilesToBuild )
    {
        failCallbackLocal->TestBuildCallback( NULL, TESTBUILDRRESULT_NO_FILES_TO_BUILD );
    }
    
    for( unsigned short proj = 0; proj < m_Projects.size(); ++proj )
    {
        TFileList filesToTest = m_Projects[ proj ].m_RuntimeFileList; // m_RuntimeFileList could change if file content changes (new includes or source dependencies) so make copy to ensure iterators valid.
        for( TFileList::iterator it = filesToTest.begin(); it != filesToTest.end(); ++it )
        {
            const Path& file = *it;
            if( file.Extension() != ".h" ) // exclude headers, use TestBuildAllRuntimeHeaders
            {
                int fileErrors = TestBuildFile( m_pCompilerLogger, this, file, failCallbackLocal, bTestFileTracking );
                if( fileErrors < 0 )
                {
                    // this means exit, and the number of errors is -ve so remove, unless -0xD1E is the response (for no error die)
                    if( fileErrors != -0xD1E )
                    {
                        numErrors -= fileErrors;
                    }
                    return numErrors;
                }
                numErrors += fileErrors;
            }
        }
    }

    if( 0 == numErrors )
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("All Tests Passed\n"); }
    }
    else
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("Tests Failed: %d\n", numErrors); }
    }
    return numErrors;
}